

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_typed_tests.hpp
# Opt level: O2

void __thiscall
iutest::detail::
TypeParamTestInstance<test::string_assertion_test::iu_StrTest_x_iutest_x_EqNull_Test,_iutest::detail::VariadicTypeList<char,_wchar_t,_char16_t,_char32_t>_>
::EachTest<iutest::detail::VariadicTypeList<wchar_t,_char16_t,_char32_t>,_void>::AddTest
          (EachTest<iutest::detail::VariadicTypeList<wchar_t,_char16_t,_char32_t>,_void> *this)

{
  UnitTest *this_00;
  
  this_00 = UnitTest::instance();
  UnitTestImpl::AddTestInfo
            (&this_00->super_UnitTestImpl,(this->m_mediator).super_iuITestSuiteMediator.m_test_suite
             ,&this->m_info);
  EachTest<iutest::detail::VariadicTypeList<char16_t,_char32_t>,_void>::AddTest(&this->m_next);
  return;
}

Assistant:

void AddTest()
        {
            // 順番通りになるように前から登録
            UnitTest::instance().AddTestInfo(m_mediator.ptr(), &m_info);
            m_next.AddTest();
        }